

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

void oonf_layer2_origin_remove(oonf_layer2_origin *origin)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  if (((origin->_node).list.next != (list_entity *)0x0) &&
     ((origin->_node).list.prev != (list_entity *)0x0)) {
    plVar2 = (_oonf_layer2_net_tree.list_head.next)->prev;
    plVar3 = _oonf_layer2_net_tree.list_head.next;
    while (plVar2 != _oonf_layer2_net_tree.list_head.prev) {
      plVar1 = plVar3->next;
      oonf_layer2_net_remove((oonf_layer2_net *)(plVar3 + -0x7a),origin);
      plVar3 = plVar1;
      plVar2 = plVar1->prev;
    }
    avl_remove(&_oonf_originator_tree,&origin->_node);
    return;
  }
  return;
}

Assistant:

void
oonf_layer2_origin_remove(struct oonf_layer2_origin *origin) {
  struct oonf_layer2_net *l2net, *l2net_it;

  if (!avl_is_node_added(&origin->_node)) {
    return;
  }

  avl_for_each_element_safe(&_oonf_layer2_net_tree, l2net, _node, l2net_it) {
    oonf_layer2_net_remove(l2net, origin);
  }

  avl_remove(&_oonf_originator_tree, &origin->_node);
}